

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O1

int drive_compressor(archive_write_filter *f,private_data_conflict9 *data,int flush,void *src,
                    size_t length)

{
  ZSTD_outBuffer *pZVar1;
  anon_enum_32 aVar2;
  size_t sVar3;
  size_t sVar4;
  archive *a;
  int iVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  ZSTD_inBuffer in;
  void *local_48;
  size_t local_40;
  size_t local_38;
  
  local_38 = 0;
  pZVar1 = &data->out;
  local_48 = src;
  local_40 = length;
  do {
    sVar4 = local_38;
    sVar3 = (data->out).pos;
    aVar2 = data->state;
    if (aVar2 == resetting) {
      ZSTD_CCtx_reset(data->cstream,1);
      data->cur_frame = data->cur_frame + 1;
      data->state = running;
      data->cur_frame_in = 0;
      data->cur_frame_out = 0;
    }
    else if (aVar2 == finishing) {
      lVar6 = ZSTD_endStream(data->cstream,pZVar1);
      iVar5 = ZSTD_isError(lVar6);
      if (iVar5 != 0) {
LAB_0026a8b7:
        a = f->archive;
        uVar8 = ZSTD_getErrorName(lVar6);
        archive_set_error(a,-1,"Zstd compression failed: %s",uVar8);
        return -0x1e;
      }
      if (lVar6 == 0) {
        data->state = resetting;
      }
    }
    else if (aVar2 == running) {
      if (local_38 == local_40) {
        return 0;
      }
      lVar6 = ZSTD_compressStream(data->cstream,pZVar1,&local_48);
      iVar5 = ZSTD_isError(lVar6);
      if (iVar5 != 0) goto LAB_0026a8b7;
    }
    data->total_in = data->total_in + (local_38 - sVar4);
    uVar7 = (local_38 - sVar4) + data->cur_frame_in;
    data->cur_frame_in = uVar7;
    sVar4 = (data->out).pos;
    uVar9 = (sVar4 - sVar3) + data->cur_frame_out;
    data->cur_frame_out = uVar9;
    if ((data->state == running) &&
       ((data->max_frame_in <= uVar7 || (data->max_frame_out <= uVar9)))) {
      data->state = finishing;
    }
    if ((sVar4 == (data->out).size) || (flush != 0 && sVar4 != 0)) {
      iVar5 = __archive_write_filter(f->next_filter,pZVar1->dst,sVar4);
      if (iVar5 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
    }
  } while( true );
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			data->stream.next_out = data->compressed;
			data->stream.avail_out =
			    (uInt)data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = deflate(&(data->stream),
		    finishing ? Z_FINISH : Z_NO_FLUSH );

		switch (ret) {
		case Z_OK:
			/* In non-finishing case, check if compressor
			 * consumed everything */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			/* In finishing case, this return always means
			 * there's more work */
			break;
		case Z_STREAM_END:
			/* This return can only occur in finishing case. */
			return (ARCHIVE_OK);
		default:
			/* Any other return value indicates an error. */
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "GZip compression failed:"
			    " deflate() call returned status %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}